

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void HeavyChange_Test_Hitter<8u>(string *PATH)

{
  long *plVar1;
  uint uVar2;
  undefined8 __ptr;
  pointer ppbVar3;
  uint num;
  uint uVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  FR<8U> *pFVar6;
  FR_CF<8U> *pFVar7;
  WavingSketch<8U,_1U,_8U> *pWVar8;
  WavingSketch<8U,_16U,_8U> *pWVar9;
  LdSketchWrapper<8U> *this;
  LdSketchWrapper<8U> *this_00;
  ostream *poVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  uint32_t j;
  uint uVar14;
  ulong uVar15;
  pointer ppbVar16;
  int iVar17;
  long lVar18;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  pointer ppbVar19;
  pointer ppbVar20;
  ulong uVar21;
  FR<8U> *local_388;
  FR_CF<8U> *local_380;
  WavingSketch<8U,_1U,_8U> *local_378;
  WavingSketch<8U,_16U,_8U> *local_370;
  LdSketchWrapper<8U> *local_368;
  FR<8U> *local_360;
  FR_CF<8U> *local_358;
  WavingSketch<8U,_1U,_8U> *local_350;
  WavingSketch<8U,_16U,_8U> *local_348;
  undefined1 local_338 [8];
  ofstream out;
  _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_138;
  undefined1 local_100 [8];
  string file;
  _Alloc_hider local_c0;
  Data<8U> packet;
  undefined1 local_a0 [32];
  _Prime_rehash_policy local_80;
  __node_base_ptr p_Stack_70;
  int local_64;
  undefined1 auStack_60 [4];
  int record_count;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)auStack_60,3,(allocator_type *)local_338);
  std::__cxx11::string::string((string *)local_100,"caida",(allocator *)local_338);
  pbVar5 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff40,&RESULT_FOLDER_abi_cxx11_,"heavychange_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 "_Recall Rate (RR).csv");
  std::ofstream::ofstream(pbVar5,(string *)local_338,_S_out);
  *_auStack_60 = pbVar5;
  std::__cxx11::string::~string((string *)local_338);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  pbVar5 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff40,&RESULT_FOLDER_abi_cxx11_,"heavychange_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 "_Precision Rate (PR).csv");
  std::ofstream::ofstream(pbVar5,(string *)local_338,_S_out);
  _auStack_60[1] = pbVar5;
  std::__cxx11::string::~string((string *)local_338);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  pbVar5 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff40,&RESULT_FOLDER_abi_cxx11_,"heavychange_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 "_F1.csv");
  std::ofstream::ofstream(pbVar5,(string *)local_338,_S_out);
  _auStack_60[2] = pbVar5;
  std::__cxx11::string::~string((string *)local_338);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  iVar17 = 0;
  while (iVar17 != 5) {
    num = iVar17 * 500000 + 2000000;
    uVar15 = (ulong)num / 1000;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",uVar15,(ulong)num % 1000);
    local_a0._0_8_ = &p_Stack_70;
    local_a0._8_8_ = 1;
    local_a0._16_8_ = 0;
    local_a0._24_8_ = 0;
    local_80._M_max_load_factor = 1.0;
    local_80._4_4_ = 0;
    local_80._M_next_resize = 0;
    p_Stack_70 = (__node_base_ptr)0x0;
    pFVar6 = (FR<8U> *)operator_new(0x90);
    FR<8U>::FR(pFVar6,num,0x6ce);
    local_388 = pFVar6;
    pFVar7 = (FR_CF<8U> *)operator_new(0x98);
    FR_CF<8U>::FR_CF(pFVar7,num,0x6ce);
    local_380 = pFVar7;
    pWVar8 = (WavingSketch<8U,_1U,_8U> *)operator_new(0xa8);
    uVar4 = num / 10;
    WavingSketch<8U,_1U,_8U>::WavingSketch(pWVar8,uVar4,0x6ce,3);
    local_378 = pWVar8;
    pWVar9 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar9,uVar4,0x6ce,3);
    local_370 = pWVar9;
    this = (LdSketchWrapper<8U> *)operator_new(0x88);
    LdSketchWrapper<8U>::LdSketchWrapper(this,uVar4,0x6ce);
    local_368 = this;
    pFVar6 = (FR<8U> *)operator_new(0x90);
    FR<8U>::FR(pFVar6,num,0x6ce);
    local_360 = pFVar6;
    pFVar7 = (FR_CF<8U> *)operator_new(0x98);
    FR_CF<8U>::FR_CF(pFVar7,num,0x6ce);
    local_358 = pFVar7;
    pWVar8 = (WavingSketch<8U,_1U,_8U> *)operator_new(0xa8);
    WavingSketch<8U,_1U,_8U>::WavingSketch(pWVar8,uVar4,0x6ce,3);
    local_350 = pWVar8;
    pWVar9 = (WavingSketch<8U,_16U,_8U> *)operator_new(0xa8);
    WavingSketch<8U,_16U,_8U>::WavingSketch(pWVar9,uVar4,0x6ce,3);
    local_348 = pWVar9;
    this_00 = (LdSketchWrapper<8U> *)operator_new(0x88);
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar17;
    LdSketchWrapper<8U>::LdSketchWrapper(this_00,uVar4,0x6ce);
    ppbVar3 = outs.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppbVar16 = outs.
               super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppbVar19 = _auStack_60;
    ppbVar20 = _auStack_60;
    if (outs.
        super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      for (; ppbVar16 = outs.
                        super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start, ppbVar20 = _auStack_60,
          ppbVar19 != ppbVar3; ppbVar19 = ppbVar19 + 1) {
        poVar10 = std::operator<<((ostream *)*ppbVar19,"MEM(KB)");
        std::operator<<(poVar10,",");
        for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
          poVar10 = std::operator<<((ostream *)*ppbVar19,
                                    (string *)&((&local_388)[lVar18]->super_Abstract<8U>).name);
          std::operator<<(poVar10,",");
        }
        std::endl<char,std::char_traits<char>>((ostream *)*ppbVar19);
      }
    }
    for (; ppbVar20 != ppbVar16; ppbVar20 = ppbVar20 + 1) {
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar20,(int)uVar15);
      std::operator<<(poVar10,",");
    }
    file.field_2._8_8_ = read_standard_data<8u>((PATH->_M_dataplus)._M_p,record_length,&local_64);
    local_c0._M_p = (pointer)0x0;
    uVar4 = local_64 / 2;
    if (9999999 < (int)uVar4) {
      uVar4 = 10000000;
    }
    uVar21 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
    uVar15 = 0;
    while (__ptr = file.field_2._8_8_, uVar15 != uVar21) {
      local_c0._M_p = *(pointer *)(file.field_2._8_8_ + uVar15 * 8);
      iVar11 = std::
               _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_a0,(key_type *)&stack0xffffffffffffff40);
      if (iVar11.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        pmVar12 = std::__detail::
                  _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_a0,(key_type *)&stack0xffffffffffffff40);
        *pmVar12 = 1;
      }
      else {
        pmVar12 = std::__detail::
                  _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_a0,(key_type *)&stack0xffffffffffffff40);
        *pmVar12 = *pmVar12 + 1;
      }
      uVar15 = uVar15 + 1;
      for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
        (**((&local_388)[lVar18]->super_Abstract<8U>)._vptr_Abstract)
                  ((&local_388)[lVar18],(string *)&stack0xffffffffffffff40);
      }
    }
    uVar2 = uVar4 * 2;
    uVar14 = (uint)uVar15;
    uVar13 = (ulong)uVar2;
    if (uVar14 != uVar2 && SBORROW4(uVar14,uVar2) == (int)(uVar14 + uVar4 * -2) < 0) {
      uVar13 = uVar15 & 0xffffffff;
    }
    while (uVar21 != uVar13) {
      local_c0._M_p = *(pointer *)(__ptr + uVar21 * 8);
      iVar11 = std::
               _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_a0,(key_type *)&stack0xffffffffffffff40);
      if (iVar11.super__Node_iterator_base<std::pair<const_Data<8U>,_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        pmVar12 = std::__detail::
                  _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_a0,(key_type *)&stack0xffffffffffffff40);
        *pmVar12 = -1;
      }
      else {
        pmVar12 = std::__detail::
                  _Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_a0,(key_type *)&stack0xffffffffffffff40);
        *pmVar12 = *pmVar12 + -1;
      }
      uVar21 = uVar21 + 1;
      for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
        (**((&local_360)[lVar18]->super_Abstract<8U>)._vptr_Abstract)
                  ((&local_360)[lVar18],(string *)&stack0xffffffffffffff40);
      }
    }
    free((void *)__ptr);
    for (lVar18 = -0x28; lVar18 != 0; lVar18 = lVar18 + 8) {
      plVar1 = *(long **)((long)&local_360 + lVar18);
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_138,
                   (_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_a0);
      (**(code **)(*plVar1 + 0x20))
                (plVar1,&local_138,*(undefined8 *)(local_338 + lVar18),auStack_60);
      std::
      _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_138);
    }
    std::ofstream::ofstream((ofstream *)local_338);
    for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      Abstract<8U>::print_f1(&(&local_388)[lVar18]->super_Abstract<8U>,(ofstream *)local_338,num);
    }
    LdSketchWrapper<8U>::average_l(this);
    printf("After average l first half: %lf\n");
    LdSketchWrapper<8U>::average_l(this);
    printf("After average l second half: %lf\n");
    ppbVar3 = outs.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (ppbVar16 = _auStack_60; ppbVar16 != ppbVar3; ppbVar16 = ppbVar16 + 1) {
      std::endl<char,std::char_traits<char>>((ostream *)*ppbVar16);
    }
    std::ofstream::~ofstream((ofstream *)local_338);
    std::
    _Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Data<8U>,_std::pair<const_Data<8U>,_int>,_std::allocator<std::pair<const_Data<8U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<8U>_>,_My_Hash<8U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_a0);
    iVar17 = outs.
             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  std::__cxx11::string::~string((string *)local_100);
  std::
  _Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~_Vector_base((_Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   *)auStack_60);
  return;
}

Assistant:

void HeavyChange_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(3);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Recall Rate (RR).csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_Precision Rate (PR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "heavychange_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 8 * HeavyChange_BLOCK + 2 * HeavyChange_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 10;
		auto mp = HashMap<DATA_LEN>();
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[1] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[2] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[3] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[4] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[5] = new FR<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[6] = new FR_CF<DATA_LEN>(memory, HeavyChange_HIT);
		sketch[7] = new WavingSketch<8, 1, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[8] = new WavingSketch<8, 16, DATA_LEN>(memory / 10, HeavyChange_HIT);
		sketch[9] = new LdSketchWrapper<DATA_LEN>(memory / 10, HeavyChange_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM / 2; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		int record_count;
		auto records =
			read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &record_count);
		Data<DATA_LEN> packet;
		int t;
		int num = 0;
		int slot_packets = std::min(record_count / 2, MAX_PACKET);
		while (num < slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = 1;
			else
				mp[packet] += 1;
			num++;

			for (int j = 0; j < SKETCH_NUM / 2; ++j) {
				sketch[j]->Init(packet);
			}
		}

		while (num < 2 * slot_packets) {
			packet = records[num];
			if (mp.find(packet) == mp.end())
				mp[packet] = -1;
			else
				mp[packet] -= 1;
			num++;

			for (int j = SKETCH_NUM / 2; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(packet);
			}
		}

		free(records);

		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			sketch[j]->Check(mp, sketch[j + (SKETCH_NUM / 2)], outs);
		}

		ofstream out;
		for (int j = 0; j < SKETCH_NUM / 2; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		printf("After average l first half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		printf("After average l second half: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketch[4])->average_l());
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}